

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec.hxx
# Opt level: O3

back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __thiscall
cryptox::
evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
::
update<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
           *this,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 first,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          last,back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               d_first)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int o_sz;
  uint8_t input [1024];
  uint8_t output [1056];
  int local_864;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_860;
  uchar local_858 [1024];
  uchar local_458 [1064];
  
  if (first._M_current != last._M_current) {
    local_860 = d_first.container;
    do {
      local_864 = 0;
      uVar4 = 0;
      do {
        uVar1 = uVar4 + 1;
        local_858[uVar4] = first._M_current[uVar4];
        if (0x3fe < uVar4) break;
        lVar2 = uVar4 + 1;
        uVar4 = uVar1;
      } while (first._M_current + lVar2 != last._M_current);
      iVar3 = EVP_DecryptUpdate(*(EVP_CIPHER_CTX **)this,local_458,&local_864,local_858,(int)uVar1);
      if (iVar3 != 1) {
        return (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
               local_860;
      }
      first._M_current = first._M_current + uVar1;
      d_first = std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (local_458,local_458 + local_864,d_first);
      *(ulong *)(this + 0x10) = *(long *)(this + 0x10) + uVar1;
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + (long)local_864;
    } while (first._M_current != last._M_current);
  }
  return (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
         d_first.container;
}

Assistant:

Output update(Input first, Input last, Output d_first) {
			Input   itr = first;
			Output oitr = d_first;

			while (itr != last) {
				std::uint8_t input[1024];
				std::uint8_t output[1024 + EVP_MAX_BLOCK_LENGTH];

				size_t i_sz = 0;
				int    o_sz = 0;

				while (i_sz < sizeof(input) && itr != last)
					input[i_sz++] = *itr++;

				if (UpdateFx(_context, output, &o_sz, input, i_sz) != 1)
					return d_first;

				oitr = std::copy(output, output + o_sz, oitr);

				_total_input += i_sz;
				_total_output += o_sz;
			}

			return oitr;
		}